

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase887::run(TestCase887 *this)

{
  StructDataBitCount *this_00;
  size_t sVar1;
  bool bVar2;
  int64_t iVar3;
  size_t sVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_740;
  size_t local_730;
  bool local_721;
  undefined1 auStack_720 [7];
  bool _kj_shouldLog_26;
  size_t local_718;
  Builder local_710;
  bool local_6f1;
  undefined1 local_6f0 [7];
  bool _kj_shouldLog_25;
  int64_t local_6d8;
  int local_6d0;
  bool local_6c9;
  undefined1 local_6c8 [7];
  bool _kj_shouldLog_24;
  bool local_6a9;
  undefined1 local_6a8 [7];
  bool _kj_shouldLog_23;
  int64_t local_690;
  int local_688;
  bool local_681;
  undefined1 local_680 [7];
  bool _kj_shouldLog_22;
  Builder sub_3;
  bool local_639;
  undefined1 local_638 [7];
  bool _kj_shouldLog_21;
  int64_t local_620;
  int local_618;
  bool local_611;
  undefined1 local_610 [7];
  bool _kj_shouldLog_20;
  bool local_5f1;
  undefined1 local_5f0 [7];
  bool _kj_shouldLog_19;
  int64_t local_5d8;
  int local_5d0;
  bool local_5c9;
  undefined1 local_5c8 [7];
  bool _kj_shouldLog_18;
  undefined1 local_5b0 [8];
  BuilderFor<capnproto_test::capnp::test::TestNewVersion> newVersion_1;
  bool local_579;
  undefined1 auStack_578 [7];
  bool _kj_shouldLog_17;
  size_t local_570;
  size_t local_568;
  size_t size6;
  ArrayPtr<const_char> local_550;
  Builder local_540;
  bool local_521;
  undefined1 local_520 [7];
  bool _kj_shouldLog_16;
  int64_t local_508;
  int local_500;
  bool local_4f9;
  undefined1 local_4f8 [7];
  bool _kj_shouldLog_15;
  Builder sub_2;
  bool local_4b1;
  undefined1 local_4b0 [7];
  bool _kj_shouldLog_14;
  int64_t local_498;
  int local_490;
  bool local_489;
  undefined1 local_488 [7];
  bool _kj_shouldLog_13;
  undefined1 local_470 [8];
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> oldVersion_1;
  bool local_439;
  undefined1 auStack_438 [7];
  bool _kj_shouldLog_12;
  size_t local_430;
  size_t local_428;
  size_t size5;
  ArrayPtr<const_char> local_410;
  ArrayPtr<const_char> local_400;
  ArrayPtr<const_char> local_3f0;
  Builder local_3e0;
  bool local_3c1;
  undefined1 local_3c0 [7];
  bool _kj_shouldLog_11;
  int64_t local_3a8;
  int local_3a0;
  bool local_399;
  undefined1 local_398 [7];
  bool _kj_shouldLog_10;
  bool local_379;
  undefined1 local_378 [7];
  bool _kj_shouldLog_9;
  int64_t local_360;
  int local_358;
  bool local_351;
  undefined1 local_350 [7];
  bool _kj_shouldLog_8;
  bool local_331;
  undefined1 local_330 [7];
  bool _kj_shouldLog_7;
  int64_t local_318;
  int local_310;
  bool local_309;
  undefined1 local_308 [7];
  bool _kj_shouldLog_6;
  bool local_2e9;
  undefined1 local_2e8 [7];
  bool _kj_shouldLog_5;
  int64_t local_2d0;
  int local_2c8;
  bool local_2c1;
  unsigned_long uStack_2c0;
  bool _kj_shouldLog_4;
  bool local_2b1;
  undefined1 auStack_2b0 [7];
  bool _kj_shouldLog_3;
  size_t local_2a8;
  undefined1 local_2a0 [8];
  Builder sub_1;
  bool local_269;
  undefined1 auStack_268 [7];
  bool _kj_shouldLog_2;
  size_t local_260;
  size_t local_258;
  size_t size3;
  undefined1 local_238 [8];
  BuilderFor<capnproto_test::capnp::test::TestNewVersion> newVersion;
  size_t size4;
  bool local_1f9;
  undefined1 auStack_1f8 [7];
  bool _kj_shouldLog_1;
  size_t local_1f0;
  size_t local_1e8;
  size_t size2;
  undefined1 local_1d0 [8];
  Builder sub;
  Builder local_198;
  undefined1 local_180 [8];
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> oldVersion;
  undefined1 auStack_150 [7];
  bool _kj_shouldLog;
  size_t local_148;
  size_t local_140;
  size_t size;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase887 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)this_00,0,FIXED_SIZE);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  _auStack_150 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  local_140 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_150);
  if (local_140 != 2) {
    oldVersion._builder._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (oldVersion._builder._39_1_ != '\0') {
      oldVersion._builder.dataSize = 2;
      kj::_::Debug::log<char_const(&)[32],unsigned_int,unsigned_long&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x381,ERROR,"\"failed: expected \" \"(2u) == (size)\", 2u, size",
                 (char (*) [32])"failed: expected (2u) == (size)",&oldVersion._builder.dataSize,
                 &local_140);
      oldVersion._builder._39_1_ = 0;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_198,(Builder *)local_128);
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestOldVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestOldVersion> *)local_180,&local_198);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1((Builder *)local_180,0x7b);
  Text::Reader::Reader((Reader *)&sub._builder.dataSize,"foo");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2
            ((Builder *)local_180,(Reader)stack0xfffffffffffffe58);
  capnproto_test::capnp::test::TestOldVersion::Builder::initOld3
            ((Builder *)local_1d0,(Builder *)local_180);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1((Builder *)local_1d0,0x1c8);
  Text::Reader::Reader((Reader *)&size2,"bar");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2((Builder *)local_1d0,(Reader)_size2)
  ;
  _auStack_1f8 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  local_1e8 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_1f8);
  if (local_140 + 4 != local_1e8) {
    local_1f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      size4 = local_140 + 4;
      kj::_::Debug::log<char_const(&)[39],unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x38e,ERROR,"\"failed: expected \" \"(size + 4) == (size2)\", size + 4, size2",
                 (char (*) [39])"failed: expected (size + 4) == (size2)",&size4,&local_1e8);
      local_1f9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&size3,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestNewVersion> *)local_238,(Builder *)&size3)
  ;
  _auStack_268 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  local_258 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_268);
  if (local_1e8 + 1 != local_258) {
    local_269 = kj::_::Debug::shouldLog(ERROR);
    while (local_269 != false) {
      sub_1._builder._32_8_ = local_1e8 + 1;
      kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x397,ERROR,"\"failed: expected \" \"(size2 + 1) == (size3)\", size2 + 1, size3",
                 (char (*) [40])"failed: expected (size2 + 1) == (size3)",
                 (unsigned_long *)&sub_1._builder.dataSize,&local_258);
      local_269 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld3
            ((Builder *)local_2a0,(Builder *)local_238);
  _auStack_2b0 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  newVersion._builder._32_8_ =
       kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                 ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_2b0);
  if (local_258 + 1 != newVersion._builder._32_8_) {
    local_2b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b1 != false) {
      uStack_2c0 = local_258 + 1;
      kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x39d,ERROR,"\"failed: expected \" \"(size3 + 1) == (size4)\", size3 + 1, size4",
                 (char (*) [40])"failed: expected (size3 + 1) == (size4)",&stack0xfffffffffffffd40,
                 (unsigned_long *)&newVersion._builder.dataSize);
      local_2b1 = false;
    }
  }
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_238);
  if (iVar3 != 0x7b) {
    local_2c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c1 != false) {
      local_2c8 = 0x7b;
      local_2d0 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1
                            ((Builder *)local_238);
      kj::_::Debug::log<char_const(&)[49],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a0,ERROR,
                 "\"failed: expected \" \"(123) == (newVersion.getOld1())\", 123, newVersion.getOld1()"
                 ,(char (*) [49])"failed: expected (123) == (newVersion.getOld1())",&local_2c8,
                 &local_2d0);
      local_2c1 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)local_2e8,(Builder *)local_238);
  bVar2 = capnp::operator==("foo",(Builder *)local_2e8);
  if (!bVar2) {
    local_2e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e9 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
                ((Builder *)local_308,(Builder *)local_238);
      kj::_::Debug::log<char_const(&)[51],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a1,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (newVersion.getOld2())\", \"foo\", newVersion.getOld2()"
                 ,(char (*) [51])"failed: expected (\"foo\") == (newVersion.getOld2())",
                 (char (*) [4])"foo",(Builder *)local_308);
      local_2e9 = false;
    }
  }
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_238);
  if (iVar3 != 0x3db) {
    local_309 = kj::_::Debug::shouldLog(ERROR);
    while (local_309 != false) {
      local_310 = 0x3db;
      local_318 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1
                            ((Builder *)local_238);
      kj::_::Debug::log<char_const(&)[49],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a2,ERROR,
                 "\"failed: expected \" \"(987) == (newVersion.getNew1())\", 987, newVersion.getNew1()"
                 ,(char (*) [49])"failed: expected (987) == (newVersion.getNew1())",&local_310,
                 &local_318);
      local_309 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
            ((Builder *)local_330,(Builder *)local_238);
  bVar2 = capnp::operator==("baz",(Builder *)local_330);
  if (!bVar2) {
    local_331 = kj::_::Debug::shouldLog(ERROR);
    while (local_331 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
                ((Builder *)local_350,(Builder *)local_238);
      kj::_::Debug::log<char_const(&)[51],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a3,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (newVersion.getNew2())\", \"baz\", newVersion.getNew2()"
                 ,(char (*) [51])"failed: expected (\"baz\") == (newVersion.getNew2())",
                 (char (*) [4])0x4bdece,(Builder *)local_350);
      local_331 = false;
    }
  }
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_2a0);
  if (iVar3 != 0x1c8) {
    local_351 = kj::_::Debug::shouldLog(ERROR);
    while (local_351 != false) {
      local_358 = 0x1c8;
      local_360 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1
                            ((Builder *)local_2a0);
      kj::_::Debug::log<char_const(&)[42],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a5,ERROR,
                 "\"failed: expected \" \"(456) == (sub.getOld1())\", 456, sub.getOld1()",
                 (char (*) [42])"failed: expected (456) == (sub.getOld1())",&local_358,&local_360);
      local_351 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)local_378,(Builder *)local_2a0);
  bVar2 = capnp::operator==("bar",(Builder *)local_378);
  if (!bVar2) {
    local_379 = kj::_::Debug::shouldLog(ERROR);
    while (local_379 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
                ((Builder *)local_398,(Builder *)local_2a0);
      kj::_::Debug::log<char_const(&)[44],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a6,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (sub.getOld2())\", \"bar\", sub.getOld2()"
                 ,(char (*) [44])"failed: expected (\"bar\") == (sub.getOld2())",
                 (char (*) [4])0x4b5bf5,(Builder *)local_398);
      local_379 = false;
    }
  }
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_2a0);
  if (iVar3 != 0x3db) {
    local_399 = kj::_::Debug::shouldLog(ERROR);
    while (local_399 != false) {
      local_3a0 = 0x3db;
      local_3a8 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1
                            ((Builder *)local_2a0);
      kj::_::Debug::log<char_const(&)[42],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a7,ERROR,
                 "\"failed: expected \" \"(987) == (sub.getNew1())\", 987, sub.getNew1()",
                 (char (*) [42])"failed: expected (987) == (sub.getNew1())",&local_3a0,&local_3a8);
      local_399 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
            ((Builder *)local_3c0,(Builder *)local_2a0);
  bVar2 = capnp::operator==("baz",(Builder *)local_3c0);
  if (!bVar2) {
    local_3c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c1 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getNew2(&local_3e0,(Builder *)local_2a0)
      ;
      kj::_::Debug::log<char_const(&)[44],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a8,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (sub.getNew2())\", \"baz\", sub.getNew2()"
                 ,(char (*) [44])"failed: expected (\"baz\") == (sub.getNew2())",
                 (char (*) [4])0x4bdece,&local_3e0);
      local_3c1 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld1((Builder *)local_238,0xea);
  Text::Reader::Reader((Reader *)&local_3f0,"qux");
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2
            ((Builder *)local_238,(Reader)local_3f0);
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew1((Builder *)local_238,0x141);
  Text::Reader::Reader((Reader *)&local_400,"quux");
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2
            ((Builder *)local_238,(Reader)local_400);
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld1((Builder *)local_2a0,0x237);
  Text::Reader::Reader((Reader *)&local_410,"corge");
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2
            ((Builder *)local_2a0,(Reader)local_410);
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew1((Builder *)local_2a0,0x28e);
  Text::Reader::Reader((Reader *)&size5,"grault");
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2((Builder *)local_2a0,(Reader)_size5)
  ;
  _auStack_438 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  local_428 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_438);
  if (newVersion._builder._32_8_ + 6 != local_428) {
    local_439 = kj::_::Debug::shouldLog(ERROR);
    while (local_439 != false) {
      oldVersion_1._builder._32_8_ = newVersion._builder._32_8_ + 6;
      kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3b7,ERROR,"\"failed: expected \" \"(size4 + 6) == (size5)\", size4 + 6, size5",
                 (char (*) [40])"failed: expected (size4 + 6) == (size5)",
                 (unsigned_long *)&oldVersion_1._builder.dataSize,&local_428);
      local_439 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_488,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestOldVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestOldVersion> *)local_470,
             (Builder *)local_488);
  iVar3 = capnproto_test::capnp::test::TestOldVersion::Builder::getOld1((Builder *)local_470);
  if (iVar3 != 0xea) {
    local_489 = kj::_::Debug::shouldLog(ERROR);
    while (local_489 != false) {
      local_490 = 0xea;
      local_498 = capnproto_test::capnp::test::TestOldVersion::Builder::getOld1
                            ((Builder *)local_470);
      kj::_::Debug::log<char_const(&)[49],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3bc,ERROR,
                 "\"failed: expected \" \"(234) == (oldVersion.getOld1())\", 234, oldVersion.getOld1()"
                 ,(char (*) [49])"failed: expected (234) == (oldVersion.getOld1())",&local_490,
                 &local_498);
      local_489 = false;
    }
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
            ((Builder *)local_4b0,(Builder *)local_470);
  bVar2 = capnp::operator==("qux",(Builder *)local_4b0);
  if (!bVar2) {
    local_4b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4b1 != false) {
      capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
                ((Builder *)&sub_2._builder.dataSize,(Builder *)local_470);
      kj::_::Debug::log<char_const(&)[51],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3bd,ERROR,
                 "\"failed: expected \" \"(\\\"qux\\\") == (oldVersion.getOld2())\", \"qux\", oldVersion.getOld2()"
                 ,(char (*) [51])"failed: expected (\"qux\") == (oldVersion.getOld2())",
                 (char (*) [4])0x4c3ec5,(Builder *)&sub_2._builder.dataSize);
      local_4b1 = false;
    }
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld3
            ((Builder *)local_4f8,(Builder *)local_470);
  iVar3 = capnproto_test::capnp::test::TestOldVersion::Builder::getOld1((Builder *)local_4f8);
  if (iVar3 != 0x237) {
    local_4f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4f9 != false) {
      local_500 = 0x237;
      local_508 = capnproto_test::capnp::test::TestOldVersion::Builder::getOld1
                            ((Builder *)local_4f8);
      kj::_::Debug::log<char_const(&)[42],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3c0,ERROR,
                 "\"failed: expected \" \"(567) == (sub.getOld1())\", 567, sub.getOld1()",
                 (char (*) [42])"failed: expected (567) == (sub.getOld1())",&local_500,&local_508);
      local_4f9 = false;
    }
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
            ((Builder *)local_520,(Builder *)local_4f8);
  bVar2 = capnp::operator==("corge",(Builder *)local_520);
  if (!bVar2) {
    local_521 = kj::_::Debug::shouldLog(ERROR);
    while (local_521 != false) {
      capnproto_test::capnp::test::TestOldVersion::Builder::getOld2(&local_540,(Builder *)local_4f8)
      ;
      kj::_::Debug::log<char_const(&)[46],char_const(&)[6],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3c1,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (sub.getOld2())\", \"corge\", sub.getOld2()"
                 ,(char (*) [46])"failed: expected (\"corge\") == (sub.getOld2())",
                 (char (*) [6])"corge",&local_540);
      local_521 = false;
    }
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1((Builder *)local_470,0x159);
  Text::Reader::Reader((Reader *)&local_550,"garply");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2
            ((Builder *)local_470,(Reader)local_550);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1((Builder *)local_4f8,0x2a6);
  Text::Reader::Reader((Reader *)&size6,"waldo");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2((Builder *)local_4f8,(Reader)_size6)
  ;
  _auStack_578 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  local_568 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_578);
  if (local_428 + 2 != local_568) {
    local_579 = kj::_::Debug::shouldLog(ERROR);
    while (local_579 != false) {
      newVersion_1._builder._32_8_ = local_428 + 2;
      kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3cc,ERROR,"\"failed: expected \" \"(size5 + 2) == (size6)\", size5 + 2, size6",
                 (char (*) [40])"failed: expected (size5 + 2) == (size6)",
                 (unsigned_long *)&newVersion_1._builder.dataSize,&local_568);
      local_579 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_5c8,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestNewVersion> *)local_5b0,
             (Builder *)local_5c8);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_5b0);
  if (iVar3 != 0x159) {
    local_5c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5c9 != false) {
      local_5d0 = 0x159;
      local_5d8 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1
                            ((Builder *)local_5b0);
      kj::_::Debug::log<char_const(&)[49],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d1,ERROR,
                 "\"failed: expected \" \"(345) == (newVersion.getOld1())\", 345, newVersion.getOld1()"
                 ,(char (*) [49])"failed: expected (345) == (newVersion.getOld1())",&local_5d0,
                 &local_5d8);
      local_5c9 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)local_5f0,(Builder *)local_5b0);
  bVar2 = capnp::operator==("garply",(Builder *)local_5f0);
  if (!bVar2) {
    local_5f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5f1 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
                ((Builder *)local_610,(Builder *)local_5b0);
      kj::_::Debug::log<char_const(&)[54],char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d2,ERROR,
                 "\"failed: expected \" \"(\\\"garply\\\") == (newVersion.getOld2())\", \"garply\", newVersion.getOld2()"
                 ,(char (*) [54])"failed: expected (\"garply\") == (newVersion.getOld2())",
                 (char (*) [7])"garply",(Builder *)local_610);
      local_5f1 = false;
    }
  }
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_5b0);
  if (iVar3 != 0x141) {
    local_611 = kj::_::Debug::shouldLog(ERROR);
    while (local_611 != false) {
      local_618 = 0x141;
      local_620 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1
                            ((Builder *)local_5b0);
      kj::_::Debug::log<char_const(&)[49],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d3,ERROR,
                 "\"failed: expected \" \"(321) == (newVersion.getNew1())\", 321, newVersion.getNew1()"
                 ,(char (*) [49])"failed: expected (321) == (newVersion.getNew1())",&local_618,
                 &local_620);
      local_611 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
            ((Builder *)local_638,(Builder *)local_5b0);
  bVar2 = capnp::operator==("quux",(Builder *)local_638);
  if (!bVar2) {
    local_639 = kj::_::Debug::shouldLog(ERROR);
    while (local_639 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
                ((Builder *)&sub_3._builder.dataSize,(Builder *)local_5b0);
      kj::_::Debug::log<char_const(&)[52],char_const(&)[5],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d4,ERROR,
                 "\"failed: expected \" \"(\\\"quux\\\") == (newVersion.getNew2())\", \"quux\", newVersion.getNew2()"
                 ,(char (*) [52])"failed: expected (\"quux\") == (newVersion.getNew2())",
                 (char (*) [5])0x4c3ecc,(Builder *)&sub_3._builder.dataSize);
      local_639 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld3
            ((Builder *)local_680,(Builder *)local_5b0);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_680);
  if (iVar3 != 0x2a6) {
    local_681 = kj::_::Debug::shouldLog(ERROR);
    while (local_681 != false) {
      local_688 = 0x2a6;
      local_690 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1
                            ((Builder *)local_680);
      kj::_::Debug::log<char_const(&)[42],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d7,ERROR,
                 "\"failed: expected \" \"(678) == (sub.getOld1())\", 678, sub.getOld1()",
                 (char (*) [42])"failed: expected (678) == (sub.getOld1())",&local_688,&local_690);
      local_681 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)local_6a8,(Builder *)local_680);
  bVar2 = capnp::operator==("waldo",(Builder *)local_6a8);
  if (!bVar2) {
    local_6a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6a9 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
                ((Builder *)local_6c8,(Builder *)local_680);
      kj::_::Debug::log<char_const(&)[46],char_const(&)[6],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d8,ERROR,
                 "\"failed: expected \" \"(\\\"waldo\\\") == (sub.getOld2())\", \"waldo\", sub.getOld2()"
                 ,(char (*) [46])"failed: expected (\"waldo\") == (sub.getOld2())",
                 (char (*) [6])"waldo",(Builder *)local_6c8);
      local_6a9 = false;
    }
  }
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_680);
  if (iVar3 != 0x28e) {
    local_6c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6c9 != false) {
      local_6d0 = 0x28e;
      local_6d8 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1
                            ((Builder *)local_680);
      kj::_::Debug::log<char_const(&)[42],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d9,ERROR,
                 "\"failed: expected \" \"(654) == (sub.getNew1())\", 654, sub.getNew1()",
                 (char (*) [42])"failed: expected (654) == (sub.getNew1())",&local_6d0,&local_6d8);
      local_6c9 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
            ((Builder *)local_6f0,(Builder *)local_680);
  bVar2 = capnp::operator==("grault",(Builder *)local_6f0);
  if (!bVar2) {
    local_6f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6f1 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getNew2(&local_710,(Builder *)local_680)
      ;
      kj::_::Debug::log<char_const(&)[47],char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3da,ERROR,
                 "\"failed: expected \" \"(\\\"grault\\\") == (sub.getNew2())\", \"grault\", sub.getNew2()"
                 ,(char (*) [47])"failed: expected (\"grault\") == (sub.getNew2())",
                 (char (*) [7])"grault",&local_710);
      local_6f1 = false;
    }
  }
  sVar1 = local_568;
  _auStack_720 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  sVar4 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_720);
  if (sVar1 != sVar4) {
    local_721 = kj::_::Debug::shouldLog(ERROR);
    while (local_721 != false) {
      AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_740 = AVar5;
      local_730 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size(&local_740);
      kj::_::Debug::log<char_const(&)[68],unsigned_long&,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3df,ERROR,
                 "\"failed: expected \" \"(size6) == (builder.getSegmentsForOutput().size())\", size6, builder.getSegmentsForOutput().size()"
                 ,(char (*) [68])
                  "failed: expected (size6) == (builder.getSegmentsForOutput().size())",&local_568,
                 &local_730);
      local_721 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, UpgradeStructInBuilderMultiSegment) {
  // Exactly like the previous test, except that we force multiple segments.  Since we force a
  // separate segment for every object, every pointer is a far pointer, and far pointers are easily
  // transferred, so this is actually not such a complicated case.

  MallocMessageBuilder builder(0, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<test::TestAnyPointer>();

  // Start with a 1-word first segment and the root object in the second segment.
  size_t size = builder.getSegmentsForOutput().size();
  EXPECT_EQ(2u, size);

  {
    auto oldVersion = root.getAnyPointerField().initAs<test::TestOldVersion>();
    oldVersion.setOld1(123);
    oldVersion.setOld2("foo");
    auto sub = oldVersion.initOld3();
    sub.setOld1(456);
    sub.setOld2("bar");
  }

  // Allocated two structs and two strings.
  size_t size2 = builder.getSegmentsForOutput().size();
  EXPECT_EQ(size + 4, size2);

  size_t size4;

  {
    auto newVersion = root.getAnyPointerField().getAs<test::TestNewVersion>();

    // Allocated a new struct.
    size_t size3 = builder.getSegmentsForOutput().size();
    EXPECT_EQ(size2 + 1, size3);

    auto sub = newVersion.getOld3();

    // Allocated another new struct for its string field.
    size4 = builder.getSegmentsForOutput().size();
    EXPECT_EQ(size3 + 1, size4);

    // Check contents.
    EXPECT_EQ(123, newVersion.getOld1());
    EXPECT_EQ("foo", newVersion.getOld2());
    EXPECT_EQ(987, newVersion.getNew1());
    EXPECT_EQ("baz", newVersion.getNew2());

    EXPECT_EQ(456, sub.getOld1());
    EXPECT_EQ("bar", sub.getOld2());
    EXPECT_EQ(987, sub.getNew1());
    EXPECT_EQ("baz", sub.getNew2());

    newVersion.setOld1(234);
    newVersion.setOld2("qux");
    newVersion.setNew1(321);
    newVersion.setNew2("quux");

    sub.setOld1(567);
    sub.setOld2("corge");
    sub.setNew1(654);
    sub.setNew2("grault");
  }

  // Set four strings and implicitly initialized two.
  size_t size5 = builder.getSegmentsForOutput().size();
  EXPECT_EQ(size4 + 6, size5);

  {
    // Go back to old version.  It should have the values set on the new version.
    auto oldVersion = root.getAnyPointerField().getAs<test::TestOldVersion>();
    EXPECT_EQ(234, oldVersion.getOld1());
    EXPECT_EQ("qux", oldVersion.getOld2());

    auto sub = oldVersion.getOld3();
    EXPECT_EQ(567, sub.getOld1());
    EXPECT_EQ("corge", sub.getOld2());

    // Overwrite the old fields.  The new fields should remain intact.
    oldVersion.setOld1(345);
    oldVersion.setOld2("garply");
    sub.setOld1(678);
    sub.setOld2("waldo");
  }

  // Set two new strings.
  size_t size6 = builder.getSegmentsForOutput().size();
  EXPECT_EQ(size5 + 2, size6);

  {
    // Back to the new version again.
    auto newVersion = root.getAnyPointerField().getAs<test::TestNewVersion>();
    EXPECT_EQ(345, newVersion.getOld1());
    EXPECT_EQ("garply", newVersion.getOld2());
    EXPECT_EQ(321, newVersion.getNew1());
    EXPECT_EQ("quux", newVersion.getNew2());

    auto sub = newVersion.getOld3();
    EXPECT_EQ(678, sub.getOld1());
    EXPECT_EQ("waldo", sub.getOld2());
    EXPECT_EQ(654, sub.getNew1());
    EXPECT_EQ("grault", sub.getNew2());
  }

  // Size should not have changed because we didn't write anything and the structs were already
  // the right size.
  EXPECT_EQ(size6, builder.getSegmentsForOutput().size());
}